

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void __thiscall
boost::xpressive::detail::
list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::swap(list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *this,list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *that)

{
  node_base *pnVar1;
  node_base *pnVar2;
  node_base *pnVar3;
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  temp;
  node_base local_10;
  
  local_10._next = &local_10;
  pnVar2 = (that->_sentry)._next;
  local_10._prev = local_10._next;
  if (pnVar2 != &that->_sentry) {
    ((that->_sentry)._prev)->_next = &local_10;
    local_10._next = (that->_sentry)._next;
    (local_10._next)->_prev = &local_10;
    local_10._prev = (that->_sentry)._prev;
    (that->_sentry)._next = &that->_sentry;
    (that->_sentry)._prev = &that->_sentry;
    pnVar2 = &that->_sentry;
  }
  pnVar3 = (this->_sentry)._next;
  if (pnVar3 != &this->_sentry) {
    ((this->_sentry)._prev)->_next = pnVar2;
    pnVar3 = ((node_base *)&pnVar2->_prev)->_prev;
    pnVar1 = (this->_sentry)._next;
    pnVar1->_prev = pnVar3;
    pnVar3->_next = pnVar1;
    ((node_base *)&pnVar2->_prev)->_prev = (this->_sentry)._prev;
    (this->_sentry)._next = &this->_sentry;
    (this->_sentry)._prev = &this->_sentry;
    pnVar3 = &this->_sentry;
  }
  if (local_10._next != &local_10) {
    (local_10._prev)->_next = pnVar3;
    pnVar2 = pnVar3->_prev;
    (local_10._next)->_prev = pnVar2;
    pnVar2->_next = local_10._next;
    pnVar3->_prev = local_10._prev;
    local_10._prev = &local_10;
    local_10._next = &local_10;
  }
  ~list((list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_10);
  return;
}

Assistant:

void swap(list &that) // throw()
        {
            list temp;
            temp.splice(temp.begin(), that);  // move that to temp
            that.splice(that.begin(), *this); // move this to that
            splice(begin(), temp);            // move temp to this
        }